

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by_dir.cc
# Opt level: O1

int add_cert_dir(BY_DIR *ctx,char *dir,int type)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  OPENSSL_STACK *pOVar6;
  CRYPTO_MUTEX *lock;
  char *pcVar7;
  ulong i;
  char *pcVar8;
  size_t sVar9;
  
  if ((dir == (char *)0x0) || (pcVar8 = dir, *dir == '\0')) {
    iVar2 = 0;
    ERR_put_error(0xb,0,0x6e,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/by_dir.cc"
                  ,0x90);
  }
  else {
    do {
      if ((*pcVar8 == ':') || (*pcVar8 == '\0')) {
        iVar2 = 3;
        sVar9 = (long)pcVar8 - (long)dir;
        if (sVar9 != 0) {
          sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->dirs);
          i = 0;
          if (sVar3 != 0) {
            do {
              pvVar4 = OPENSSL_sk_value((OPENSSL_STACK *)ctx->dirs,i);
              pcVar7 = *(char **)((long)pvVar4 + 0x38);
              sVar5 = strlen(pcVar7);
              if ((sVar5 == sVar9) && (iVar2 = strncmp(pcVar7,dir,sVar9), iVar2 == 0)) break;
              i = i + 1;
              sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->dirs);
            } while (i < sVar3);
          }
          sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->dirs);
          iVar2 = 3;
          if (sVar3 <= i) {
            if (ctx->dirs == (stack_st_BY_DIR_ENTRY *)0x0) {
              pOVar6 = OPENSSL_sk_new_null();
              ctx->dirs = (stack_st_BY_DIR_ENTRY *)pOVar6;
              if (pOVar6 != (OPENSSL_STACK *)0x0) goto LAB_00320de7;
            }
            else {
LAB_00320de7:
              lock = (CRYPTO_MUTEX *)OPENSSL_malloc(0x50);
              iVar2 = 1;
              if (lock == (CRYPTO_MUTEX *)0x0) goto LAB_00320e57;
              CRYPTO_MUTEX_init(lock);
              *(int *)((long)lock + 0x40) = type;
              pOVar6 = OPENSSL_sk_new(by_dir_hash_cmp);
              *(OPENSSL_STACK **)((long)lock + 0x48) = pOVar6;
              pcVar7 = OPENSSL_strndup(dir,sVar9);
              lock[1].__align = (long)pcVar7;
              if ((pcVar7 != (char *)0x0) && (*(long *)((long)lock + 0x48) != 0)) {
                sVar9 = OPENSSL_sk_push((OPENSSL_STACK *)ctx->dirs,lock);
                iVar2 = 0;
                if (sVar9 != 0) goto LAB_00320e57;
              }
              by_dir_entry_free((BY_DIR_ENTRY *)&lock->__data);
            }
            iVar2 = 1;
          }
        }
LAB_00320e57:
        dir = pcVar8 + 1;
        if ((iVar2 != 3) && (iVar2 != 0)) {
          return 0;
        }
      }
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar1 != '\0');
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int add_cert_dir(BY_DIR *ctx, const char *dir, int type) {
  size_t j, len;
  const char *s, *ss, *p;

  if (dir == NULL || !*dir) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_DIRECTORY);
    return 0;
  }

  s = dir;
  p = s;
  do {
    if (*p == DIR_HASH_SEPARATOR || *p == '\0') {
      BY_DIR_ENTRY *ent;
      ss = s;
      s = p + 1;
      len = p - ss;
      if (len == 0) {
        continue;
      }
      for (j = 0; j < sk_BY_DIR_ENTRY_num(ctx->dirs); j++) {
        ent = sk_BY_DIR_ENTRY_value(ctx->dirs, j);
        if (strlen(ent->dir) == len && strncmp(ent->dir, ss, len) == 0) {
          break;
        }
      }
      if (j < sk_BY_DIR_ENTRY_num(ctx->dirs)) {
        continue;
      }
      if (ctx->dirs == NULL) {
        ctx->dirs = sk_BY_DIR_ENTRY_new_null();
        if (!ctx->dirs) {
          return 0;
        }
      }
      ent = reinterpret_cast<BY_DIR_ENTRY *>(
          OPENSSL_malloc(sizeof(BY_DIR_ENTRY)));
      if (!ent) {
        return 0;
      }
      CRYPTO_MUTEX_init(&ent->lock);
      ent->dir_type = type;
      ent->hashes = sk_BY_DIR_HASH_new(by_dir_hash_cmp);
      ent->dir = OPENSSL_strndup(ss, len);
      if (ent->dir == NULL || ent->hashes == NULL ||
          !sk_BY_DIR_ENTRY_push(ctx->dirs, ent)) {
        by_dir_entry_free(ent);
        return 0;
      }
    }
  } while (*p++ != '\0');
  return 1;
}